

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O2

back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>
pstore::details::decode4<std::back_insert_iterator<pstore::small_vector<unsigned_char,128ul>>>
          (array<unsigned_char,_4UL> *in,
          back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> out,uint count)

{
  ulong uVar1;
  array<unsigned_char,_3UL> result;
  byte local_1b [3];
  
  local_1b[0] = in->_M_elems[1] >> 4 & 3 | in->_M_elems[0] << 2;
  local_1b[1] = in->_M_elems[2] >> 2 & 0xf | in->_M_elems[1] << 4;
  local_1b[2] = in->_M_elems[2] * '@' + in->_M_elems[3];
  for (uVar1 = 0; count != uVar1; uVar1 = uVar1 + 1) {
    small_vector<unsigned_char,_128UL>::push_back(out.container,local_1b + uVar1);
  }
  return (back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>)out.container;
}

Assistant:

OutputIterator decode4 (std::array<std::uint8_t, 4> const & in, OutputIterator out,
                                unsigned const count) {
            std::array<std::uint8_t, 3> result;
            result[0] = static_cast<std::uint8_t> (static_cast<std::uint8_t> (in[0] << 2) +
                                                   ((in[1] & 0x30U) >> 4));
            result[1] = static_cast<std::uint8_t> (((in[1] & 0xFU) << 4) + ((in[2] & 0x3CU) >> 2));
            result[2] = static_cast<std::uint8_t> (((in[2] & 0x3U) << 6) + in[3]);
            for (auto ctr = 0U; ctr < count; ++ctr) {
                *out = result[ctr];
                ++out;
            }
            return out;
        }